

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPT.cpp
# Opt level: O2

void __thiscall OpenMD::NPT::doUpdateSizes(NPT *this)

{
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (&this->oldPos,
             (ulong)(uint)((this->super_VelocityVerletIntegrator).super_Integrator.info_)->
                          nIntegrableObjects_);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (&this->oldVel,
             (ulong)(uint)((this->super_VelocityVerletIntegrator).super_Integrator.info_)->
                          nIntegrableObjects_);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (&this->oldJi,
             (ulong)(uint)((this->super_VelocityVerletIntegrator).super_Integrator.info_)->
                          nIntegrableObjects_);
  return;
}

Assistant:

void NPT::doUpdateSizes() {
    oldPos.resize(info_->getNIntegrableObjects());
    oldVel.resize(info_->getNIntegrableObjects());
    oldJi.resize(info_->getNIntegrableObjects());
  }